

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O0

uint64_t av1_wedge_sse_from_residuals_sse2(int16_t *r1,int16_t *d,uint8_t *m,int N)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i v_sum1_q;
  __m128i v_sum0_q;
  __m128i v_sq1_d;
  __m128i v_sq0_d;
  __m128i v_t1_w;
  __m128i v_t0_w;
  __m128i v_t1h_d;
  __m128i v_t1l_d;
  __m128i v_t0h_d;
  __m128i v_t0l_d;
  __m128i v_m1h_w;
  __m128i v_m1l_w;
  __m128i v_m0h_w;
  __m128i v_m0l_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_rd1h_w;
  __m128i v_rd1l_w;
  __m128i v_rd0h_w;
  __m128i v_rd0l_w;
  __m128i v_m01_b;
  __m128i v_d1_w;
  __m128i v_d0_w;
  __m128i v_r1_w;
  __m128i v_r0_w;
  __m128i v_acc0_q;
  __m128i v_zext_q;
  __m128i v_mask_max_w;
  uint64_t csse;
  int n8;
  int n;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_41c;
  undefined4 local_418;
  undefined2 uStack_3a4;
  undefined2 uStack_384;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_31c;
  undefined2 uStack_2fc;
  undefined2 uStack_2f0;
  undefined2 uStack_2ee;
  undefined2 uStack_2ec;
  undefined2 uStack_2ea;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  undefined2 uStack_2d0;
  undefined2 uStack_2ce;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  undefined2 uStack_2c0;
  undefined2 uStack_2be;
  undefined2 uStack_2bc;
  undefined2 uStack_2ba;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 uStack_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  undefined1 uStack_27c;
  undefined1 uStack_27b;
  undefined1 uStack_27a;
  undefined1 uStack_279;
  
  local_418 = -in_ECX;
  local_41c = local_418 + 8;
  local_458 = 0;
  uStack_450 = 0;
  lVar4 = in_RDI + (long)in_ECX * 2;
  lVar5 = in_RSI + (long)in_ECX * 2;
  do {
    xx_load_128((void *)(lVar4 + (long)local_418 * 2));
    xx_load_128((void *)(lVar4 + (long)local_41c * 2));
    xx_load_128((void *)(lVar5 + (long)local_418 * 2));
    xx_load_128((void *)(lVar5 + (long)local_41c * 2));
    xx_load_128((void *)(in_RDX + in_ECX + (long)local_418));
    local_348 = (undefined2)extraout_XMM0_Qa_01;
    uStack_346 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x10);
    uStack_344 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    uStack_342 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x30);
    local_358 = (undefined2)extraout_XMM0_Qa;
    uStack_356 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_354 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_352 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x30);
    uStack_2c0 = (undefined2)extraout_XMM0_Qb_01;
    uStack_2be = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x10);
    uStack_2bc = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    uStack_2ba = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x30);
    uStack_2d0 = (undefined2)extraout_XMM0_Qb;
    uStack_2ce = (undefined2)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_2cc = (undefined2)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_2ca = (undefined2)((ulong)extraout_XMM0_Qb >> 0x30);
    local_368 = (undefined2)extraout_XMM0_Qa_02;
    uStack_366 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x10);
    uStack_364 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    uStack_362 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x30);
    local_378 = (undefined2)extraout_XMM0_Qa_00;
    uStack_376 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_374 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_372 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_2e0 = (undefined2)extraout_XMM0_Qb_02;
    uStack_2de = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x10);
    uStack_2dc = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    uStack_2da = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x30);
    uStack_2f0 = (undefined2)extraout_XMM0_Qb_00;
    uStack_2ee = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_2ec = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_2ea = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    local_2a8 = (byte)extraout_XMM0_Qa_03;
    uStack_2a7 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 8);
    uStack_2a6 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
    uStack_2a5 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x18);
    uStack_2a4 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
    uStack_2a3 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x28);
    uStack_2a2 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
    uStack_2a1 = (undefined1)((ulong)extraout_XMM0_Qa_03 >> 0x38);
    uStack_280 = (byte)extraout_XMM0_Qb_03;
    uStack_27f = (undefined1)((ulong)extraout_XMM0_Qb_03 >> 8);
    uStack_27e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
    uStack_27d = (undefined1)((ulong)extraout_XMM0_Qb_03 >> 0x18);
    uStack_27c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
    uStack_27b = (undefined1)((ulong)extraout_XMM0_Qb_03 >> 0x28);
    uStack_27a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
    uStack_279 = (undefined1)((ulong)extraout_XMM0_Qb_03 >> 0x38);
    auVar6[1] = 0;
    auVar6[0] = local_2a8;
    uStack_384 = CONCAT11(0,uStack_2a6);
    auVar7[1] = 0;
    auVar7[0] = uStack_2a4;
    uStack_2fc = CONCAT11(0,uStack_2a2);
    auVar8[1] = 0;
    auVar8[0] = uStack_280;
    uStack_3a4 = CONCAT11(0,uStack_27e);
    auVar9[1] = 0;
    auVar9[0] = uStack_27c;
    uStack_31c = CONCAT11(0,uStack_27a);
    auVar3._2_2_ = local_358;
    auVar3._0_2_ = local_348;
    auVar3._4_2_ = uStack_346;
    auVar3._6_2_ = uStack_356;
    auVar3._10_2_ = uStack_354;
    auVar3._8_2_ = uStack_344;
    auVar3._12_2_ = uStack_342;
    auVar3._14_2_ = uStack_352;
    auVar6._2_2_ = 0x40;
    auVar6[4] = uStack_2a7;
    auVar6[5] = 0;
    auVar6._6_2_ = 0x40;
    auVar6._10_2_ = 0x40;
    auVar6._8_2_ = uStack_384;
    auVar6[0xc] = uStack_2a5;
    auVar6[0xd] = 0;
    auVar6._14_2_ = 0x40;
    auVar6 = pmaddwd(auVar3,auVar6);
    auVar2._2_2_ = uStack_2d0;
    auVar2._0_2_ = uStack_2c0;
    auVar2._4_2_ = uStack_2be;
    auVar2._6_2_ = uStack_2ce;
    auVar2._10_2_ = uStack_2cc;
    auVar2._8_2_ = uStack_2bc;
    auVar2._12_2_ = uStack_2ba;
    auVar2._14_2_ = uStack_2ca;
    auVar7._2_2_ = 0x40;
    auVar7[4] = uStack_2a3;
    auVar7[5] = 0;
    auVar7._6_2_ = 0x40;
    auVar7._10_2_ = 0x40;
    auVar7._8_2_ = uStack_2fc;
    auVar7[0xc] = uStack_2a1;
    auVar7[0xd] = 0;
    auVar7._14_2_ = 0x40;
    auVar7 = pmaddwd(auVar2,auVar7);
    auVar1._2_2_ = local_378;
    auVar1._0_2_ = local_368;
    auVar1._4_2_ = uStack_366;
    auVar1._6_2_ = uStack_376;
    auVar1._10_2_ = uStack_374;
    auVar1._8_2_ = uStack_364;
    auVar1._12_2_ = uStack_362;
    auVar1._14_2_ = uStack_372;
    auVar8._2_2_ = 0x40;
    auVar8[4] = uStack_27f;
    auVar8[5] = 0;
    auVar8._6_2_ = 0x40;
    auVar8._10_2_ = 0x40;
    auVar8._8_2_ = uStack_3a4;
    auVar8[0xc] = uStack_27d;
    auVar8[0xd] = 0;
    auVar8._14_2_ = 0x40;
    auVar8 = pmaddwd(auVar1,auVar8);
    auVar10._2_2_ = uStack_2f0;
    auVar10._0_2_ = uStack_2e0;
    auVar10._4_2_ = uStack_2de;
    auVar10._6_2_ = uStack_2ee;
    auVar10._10_2_ = uStack_2ec;
    auVar10._8_2_ = uStack_2dc;
    auVar10._12_2_ = uStack_2da;
    auVar10._14_2_ = uStack_2ea;
    auVar9._2_2_ = 0x40;
    auVar9[4] = uStack_27b;
    auVar9[5] = 0;
    auVar9._6_2_ = 0x40;
    auVar9._10_2_ = 0x40;
    auVar9._8_2_ = uStack_31c;
    auVar9[0xc] = uStack_279;
    auVar9[0xd] = 0;
    auVar9._14_2_ = 0x40;
    auVar9 = pmaddwd(auVar10,auVar9);
    auVar10 = packssdw(auVar6,auVar7);
    auVar9 = packssdw(auVar8,auVar9);
    auVar10 = pmaddwd(auVar10,auVar10);
    auVar9 = pmaddwd(auVar9,auVar9);
    local_5b8 = auVar10._0_8_;
    uStack_5b0 = auVar10._8_8_;
    local_5c8 = auVar9._0_8_;
    uStack_5c0 = auVar9._8_8_;
    local_458 = local_458 + (local_5b8 & 0xffffffff) + (local_5b8 >> 0x20) +
                (local_5c8 & 0xffffffff) + (local_5c8 >> 0x20);
    uStack_450 = uStack_450 + (uStack_5b0 & 0xffffffff) + (uStack_5b0 >> 0x20) +
                 (uStack_5c0 & 0xffffffff) + (uStack_5c0 >> 0x20);
    local_41c = local_41c + 0x10;
    local_418 = local_418 + 0x10;
  } while (local_418 != 0);
  return local_458 + uStack_450 + 0x800U >> 0xc;
}

Assistant:

uint64_t av1_wedge_sse_from_residuals_sse2(const int16_t *r1, const int16_t *d,
                                           const uint8_t *m, int N) {
  int n = -N;
  int n8 = n + 8;

  uint64_t csse;

  const __m128i v_mask_max_w = _mm_set1_epi16(MAX_MASK_VALUE);
  const __m128i v_zext_q = _mm_set1_epi64x(~0u);

  __m128i v_acc0_q = _mm_setzero_si128();

  assert(N % 64 == 0);

  r1 += N;
  d += N;
  m += N;

  do {
    const __m128i v_r0_w = xx_load_128(r1 + n);
    const __m128i v_r1_w = xx_load_128(r1 + n8);
    const __m128i v_d0_w = xx_load_128(d + n);
    const __m128i v_d1_w = xx_load_128(d + n8);
    const __m128i v_m01_b = xx_load_128(m + n);

    const __m128i v_rd0l_w = _mm_unpacklo_epi16(v_d0_w, v_r0_w);
    const __m128i v_rd0h_w = _mm_unpackhi_epi16(v_d0_w, v_r0_w);
    const __m128i v_rd1l_w = _mm_unpacklo_epi16(v_d1_w, v_r1_w);
    const __m128i v_rd1h_w = _mm_unpackhi_epi16(v_d1_w, v_r1_w);
    const __m128i v_m0_w = _mm_unpacklo_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m1_w = _mm_unpackhi_epi8(v_m01_b, _mm_setzero_si128());

    const __m128i v_m0l_w = _mm_unpacklo_epi16(v_m0_w, v_mask_max_w);
    const __m128i v_m0h_w = _mm_unpackhi_epi16(v_m0_w, v_mask_max_w);
    const __m128i v_m1l_w = _mm_unpacklo_epi16(v_m1_w, v_mask_max_w);
    const __m128i v_m1h_w = _mm_unpackhi_epi16(v_m1_w, v_mask_max_w);

    const __m128i v_t0l_d = _mm_madd_epi16(v_rd0l_w, v_m0l_w);
    const __m128i v_t0h_d = _mm_madd_epi16(v_rd0h_w, v_m0h_w);
    const __m128i v_t1l_d = _mm_madd_epi16(v_rd1l_w, v_m1l_w);
    const __m128i v_t1h_d = _mm_madd_epi16(v_rd1h_w, v_m1h_w);

    const __m128i v_t0_w = _mm_packs_epi32(v_t0l_d, v_t0h_d);
    const __m128i v_t1_w = _mm_packs_epi32(v_t1l_d, v_t1h_d);

    const __m128i v_sq0_d = _mm_madd_epi16(v_t0_w, v_t0_w);
    const __m128i v_sq1_d = _mm_madd_epi16(v_t1_w, v_t1_w);

    const __m128i v_sum0_q = _mm_add_epi64(_mm_and_si128(v_sq0_d, v_zext_q),
                                           _mm_srli_epi64(v_sq0_d, 32));
    const __m128i v_sum1_q = _mm_add_epi64(_mm_and_si128(v_sq1_d, v_zext_q),
                                           _mm_srli_epi64(v_sq1_d, 32));

    v_acc0_q = _mm_add_epi64(v_acc0_q, v_sum0_q);
    v_acc0_q = _mm_add_epi64(v_acc0_q, v_sum1_q);

    n8 += 16;
    n += 16;
  } while (n);

  v_acc0_q = _mm_add_epi64(v_acc0_q, _mm_srli_si128(v_acc0_q, 8));

#if AOM_ARCH_X86_64
  csse = (uint64_t)_mm_cvtsi128_si64(v_acc0_q);
#else
  xx_storel_64(&csse, v_acc0_q);
#endif

  return ROUND_POWER_OF_TWO(csse, 2 * WEDGE_WEIGHT_BITS);
}